

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSmartListTest_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldSmartListTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  TestField *pTVar3;
  char *in_R9;
  AssertHelper local_430;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__1;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string diff_report;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldSmartListTest_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),1);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),2);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),3);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),9);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),4);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),5);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),7);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),2);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,9);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,0);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,2);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,7);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,3);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,4);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,5);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,6);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,2);
  std::__cxx11::string::string((string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&gtest_ar_.message_,(string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::set_repeated_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,AS_SMART_LIST);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)&gtest_ar_.message_,
                     (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180);
  local_371 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_370,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x613,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  testing::internal::EqHelper::
  Compare<char[249],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3b8,
             "\"deleted: rv[0]: 1\\n\" \"added: rv[0]: 9\\n\" \"added: rv[1]: 0\\n\" \"moved: rv[1] -> rv[2] : 2\\n\" \"added: rv[3]: 7\\n\" \"moved: rv[2] -> rv[4] : 3\\n\" \"deleted: rv[3]: 9\\n\" \"moved: rv[4] -> rv[5] : 4\\n\" \"moved: rv[5] -> rv[6] : 5\\n\" \"deleted: rv[6]: 7\\n\" \"added: rv[7]: 6\\n\" \"moved: rv[7] -> rv[8] : 2\\n\""
             ,"diff_report",
             (char (*) [249])
             "deleted: rv[0]: 1\nadded: rv[0]: 9\nadded: rv[1]: 0\nmoved: rv[1] -> rv[2] : 2\nadded: rv[3]: 7\nmoved: rv[2] -> rv[4] : 3\ndeleted: rv[3]: 9\nmoved: rv[4] -> rv[5] : 4\nmoved: rv[5] -> rv[6] : 5\ndeleted: rv[6]: 7\nadded: rv[7]: 6\nmoved: rv[7] -> rv[8] : 2\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &differencer.unpack_any_field_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x621,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  proto2_unittest::TestDiffMessage::Clear((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage::Clear((TestDiffMessage *)local_180);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::set_a(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::set_a(pTVar3,2);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::set_a(pTVar3,3);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::set_a(pTVar3,4);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::set_a(pTVar3,5);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::set_a(pTVar3,2);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::set_a(pTVar3,6);
  pTVar3 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::set_a(pTVar3,4);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&gtest_ar_.message_,(string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::set_repeated_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,AS_SMART_LIST);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)&gtest_ar_.message_,
                     (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180);
  local_3d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_3d8,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x633,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  testing::internal::EqHelper::
  Compare<char[165],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_420,
             "\"deleted: rm[0]: { a: 1 }\\n\" \"moved: rm[1] -> rm[0] : { a: 2 }\\n\" \"deleted: rm[2]: { a: 3 }\\n\" \"added: rm[1]: { a: 6 }\\n\" \"moved: rm[3] -> rm[2] : { a: 4 }\\n\" \"deleted: rm[4]: { a: 5 }\\n\""
             ,"diff_report",
             (char (*) [165])
             "deleted: rm[0]: { a: 1 }\nmoved: rm[1] -> rm[0] : { a: 2 }\ndeleted: rm[2]: { a: 3 }\nadded: rm[1]: { a: 6 }\nmoved: rm[3] -> rm[2] : { a: 4 }\ndeleted: rm[4]: { a: 5 }\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &differencer.unpack_any_field_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x63b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartListTest) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(1);
  msg1.add_rv(2);
  msg1.add_rv(3);
  msg1.add_rv(9);
  msg1.add_rv(4);
  msg1.add_rv(5);
  msg1.add_rv(7);
  msg1.add_rv(2);
  msg2.add_rv(9);
  msg2.add_rv(0);
  msg2.add_rv(2);
  msg2.add_rv(7);
  msg2.add_rv(3);
  msg2.add_rv(4);
  msg2.add_rv(5);
  msg2.add_rv(6);
  msg2.add_rv(2);
  // Compare
  // a: 1,      2,    3, 9, 4, 5, 7,   2
  // b:   9, 0, 2, 7, 3,    4, 5,   6, 2
  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "deleted: rv[0]: 1\n"
      "added: rv[0]: 9\n"
      "added: rv[1]: 0\n"
      "moved: rv[1] -> rv[2] : 2\n"
      "added: rv[3]: 7\n"
      "moved: rv[2] -> rv[4] : 3\n"
      "deleted: rv[3]: 9\n"
      "moved: rv[4] -> rv[5] : 4\n"
      "moved: rv[5] -> rv[6] : 5\n"
      "deleted: rv[6]: 7\n"
      "added: rv[7]: 6\n"
      "moved: rv[7] -> rv[8] : 2\n",
      diff_report);

  // Compare two sub messages
  // a: 1, 2, 3,    4, 5
  // b:    2,    6, 4,
  msg1.Clear();
  msg2.Clear();
  msg1.add_rm()->set_a(1);
  msg1.add_rm()->set_a(2);
  msg1.add_rm()->set_a(3);
  msg1.add_rm()->set_a(4);
  msg1.add_rm()->set_a(5);
  msg2.add_rm()->set_a(2);
  msg2.add_rm()->set_a(6);
  msg2.add_rm()->set_a(4);
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "deleted: rm[0]: { a: 1 }\n"
      "moved: rm[1] -> rm[0] : { a: 2 }\n"
      "deleted: rm[2]: { a: 3 }\n"
      "added: rm[1]: { a: 6 }\n"
      "moved: rm[3] -> rm[2] : { a: 4 }\n"
      "deleted: rm[4]: { a: 5 }\n",
      diff_report);
}